

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void Assimp::IFC::ConvertCartesianPoint(IfcVector3 *out,IfcCartesianPoint *in)

{
  long lVar1;
  ulong uVar2;
  IfcVector3 *pIVar3;
  
  out->x = 0.0;
  out->y = 0.0;
  out->z = 0.0;
  lVar1 = *(long *)&(in->super_IfcPoint).field_0x40;
  if (*(long *)&in->field_0x48 != lVar1) {
    uVar2 = 0;
    do {
      pIVar3 = (IfcVector3 *)&out->z;
      if (((int)uVar2 != 2) && (pIVar3 = out, (int)uVar2 == 1)) {
        pIVar3 = (IfcVector3 *)&out->y;
      }
      pIVar3->x = *(double *)(lVar1 + uVar2 * 8);
      uVar2 = uVar2 + 1;
      lVar1 = *(long *)&(in->super_IfcPoint).field_0x40;
    } while (uVar2 < (ulong)(*(long *)&in->field_0x48 - lVar1 >> 3));
  }
  return;
}

Assistant:

void ConvertCartesianPoint(IfcVector3& out, const Schema_2x3::IfcCartesianPoint& in)
{
    out = IfcVector3();
    for(size_t i = 0; i < in.Coordinates.size(); ++i) {
        out[static_cast<unsigned int>(i)] = in.Coordinates[i];
    }
}